

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImGuiID ImGui::AddContextHook(ImGuiContext *ctx,ImGuiContextHook *hook)

{
  int *piVar1;
  int iVar2;
  ImGuiContextHook *pIVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  ImGuiContextHook *pIVar7;
  int iVar8;
  ImGuiID IVar9;
  long lVar10;
  int iVar11;
  
  iVar11 = (ctx->Hooks).Size;
  iVar2 = (ctx->Hooks).Capacity;
  if (iVar11 == iVar2) {
    iVar11 = iVar11 + 1;
    if (iVar2 == 0) {
      iVar8 = 8;
    }
    else {
      iVar8 = iVar2 / 2 + iVar2;
    }
    if (iVar11 < iVar8) {
      iVar11 = iVar8;
    }
    if (iVar2 < iVar11) {
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      pIVar7 = (ImGuiContextHook *)(*GImAllocatorAllocFunc)((long)iVar11 << 5,GImAllocatorUserData);
      pIVar3 = (ctx->Hooks).Data;
      if (pIVar3 != (ImGuiContextHook *)0x0) {
        memcpy(pIVar7,pIVar3,(long)(ctx->Hooks).Size << 5);
        pIVar3 = (ctx->Hooks).Data;
        if ((pIVar3 != (ImGuiContextHook *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(pIVar3,GImAllocatorUserData);
      }
      (ctx->Hooks).Data = pIVar7;
      (ctx->Hooks).Capacity = iVar11;
    }
  }
  pIVar3 = (ctx->Hooks).Data;
  lVar10 = (long)(ctx->Hooks).Size * 0x20;
  uVar4 = *(undefined8 *)hook;
  uVar5 = *(undefined8 *)(hook + 8);
  uVar6 = *(undefined8 *)(hook + 0x18);
  pIVar7 = pIVar3 + lVar10 + 0x10;
  *(undefined8 *)pIVar7 = *(undefined8 *)(hook + 0x10);
  *(undefined8 *)(pIVar7 + 8) = uVar6;
  pIVar3 = pIVar3 + lVar10;
  *(undefined8 *)pIVar3 = uVar4;
  *(undefined8 *)(pIVar3 + 8) = uVar5;
  lVar10 = (long)(ctx->Hooks).Size + 1;
  (ctx->Hooks).Size = (int)lVar10;
  IVar9 = ctx->HookIdNext + 1;
  ctx->HookIdNext = IVar9;
  *(ImGuiID *)((ctx->Hooks).Data + lVar10 * 0x20 + -0x20) = IVar9;
  return ctx->HookIdNext;
}

Assistant:

ImGuiID ImGui::AddContextHook(ImGuiContext* ctx, const ImGuiContextHook* hook)
{
    ImGuiContext& g = *ctx;
    IM_ASSERT(hook->Callback != NULL && hook->HookId == 0 && hook->Type != ImGuiContextHookType_PendingRemoval_);
    g.Hooks.push_back(*hook);
    g.Hooks.back().HookId = ++g.HookIdNext;
    return g.HookIdNext;
}